

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# delay.c
# Opt level: O2

int delay_segment_set(uint32_t field,void *value,mixed_segment *segment)

{
  uint uVar1;
  void *pvVar2;
  int code;
  code *pcVar3;
  float fVar4;
  
  if (field == 1) {
    if (*value == '\x01') {
      pcVar3 = delay_segment_mix_bypass;
    }
    else {
      pcVar3 = delay_segment_mix;
    }
    segment->mix = pcVar3;
    return 1;
  }
  pvVar2 = segment->data;
  if (field == 0x16) {
    fVar4 = *value;
    if (0.0 <= fVar4) {
      *(float *)((long)pvVar2 + 0x30) = fVar4;
      fVar4 = (float)*(uint *)((long)pvVar2 + 0x34) * fVar4;
LAB_00134fef:
      fVar4 = ceilf(fVar4);
      mixed_buffer_resize((uint32_t)(long)fVar4,(mixed_buffer *)((long)pvVar2 + 0x10));
      return 1;
    }
  }
  else {
    if (field != 2) {
      code = 7;
      goto LAB_00134fd4;
    }
    uVar1 = *value;
    if (uVar1 != 0) {
      *(uint *)((long)pvVar2 + 0x34) = uVar1;
      fVar4 = (float)uVar1 * *(float *)((long)pvVar2 + 0x30);
      goto LAB_00134fef;
    }
  }
  code = 8;
LAB_00134fd4:
  mixed_err(code);
  return 0;
}

Assistant:

int delay_segment_set(uint32_t field, void *value, struct mixed_segment *segment){
  struct delay_segment_data *data = (struct delay_segment_data *)segment->data;
  switch(field){
  case MIXED_SAMPLERATE:
    if(*(uint32_t *)value <= 0){
      mixed_err(MIXED_INVALID_VALUE);
      return 0;
    }
    data->samplerate = *(uint32_t *)value;
    mixed_buffer_resize(ceil(data->samplerate * data->time), &data->buffer);
    break;
  case MIXED_DELAY_TIME:
    if(*(float *)value < 0.0){
      mixed_err(MIXED_INVALID_VALUE);
      return 0;
    }
    data->time = *(float *)value;
    mixed_buffer_resize(ceil(data->samplerate * data->time), &data->buffer);
    break;
  case MIXED_BYPASS:
    if(*(bool *)value){
      segment->mix = delay_segment_mix_bypass;
    }else{
      segment->mix = delay_segment_mix;
    }
    break;
  default:
    mixed_err(MIXED_INVALID_FIELD);
    return 0;
  }
  return 1;
}